

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

Node * __thiscall
Patch::build_node(Patch *this,Node *left,Node *right,Point old_distance_from_left_ancestor,
                 Point new_distance_from_left_ancestor,Point old_extent,Point new_extent,
                 optional<Text> *old_text,optional<Text> *new_text,uint32_t old_text_size)

{
  pointer pcVar1;
  Text *pTVar2;
  pointer *__ptr;
  _Head_base<0UL,_Text_*,_false> local_58;
  _Head_base<0UL,_Text_*,_false> local_50;
  Node *local_48;
  Point local_40;
  Point local_38;
  
  this->change_count = this->change_count + 1;
  local_40 = old_extent;
  local_38 = old_distance_from_left_ancestor;
  local_48 = (Node *)operator_new(0x50);
  if (old_text->is_some == true) {
    pTVar2 = (Text *)operator_new(0x38);
    (pTVar2->content)._M_dataplus._M_p = (pointer)&(pTVar2->content).field_2;
    pcVar1 = (old_text->value).content._M_dataplus._M_p;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)pTVar2,pcVar1,pcVar1 + (old_text->value).content._M_string_length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pTVar2->line_offsets,&(old_text->value).line_offsets);
  }
  else {
    pTVar2 = (Text *)0x0;
  }
  local_58._M_head_impl = pTVar2;
  if (new_text->is_some == true) {
    pTVar2 = (Text *)operator_new(0x38);
    (pTVar2->content)._M_dataplus._M_p = (pointer)&(pTVar2->content).field_2;
    pcVar1 = (new_text->value).content._M_dataplus._M_p;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)pTVar2,pcVar1,pcVar1 + (new_text->value).content._M_string_length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pTVar2->line_offsets,&(new_text->value).line_offsets);
  }
  else {
    pTVar2 = (Text *)0x0;
  }
  local_50._M_head_impl = pTVar2;
  Node::Node(local_48,left,right,local_40,new_extent,local_38,new_distance_from_left_ancestor,
             (unique_ptr<Text,_std::default_delete<Text>_> *)&local_58,
             (unique_ptr<Text,_std::default_delete<Text>_> *)&local_50,old_text_size);
  if (local_50._M_head_impl != (Text *)0x0) {
    std::default_delete<Text>::operator()((default_delete<Text> *)&local_50,local_50._M_head_impl);
  }
  if (local_58._M_head_impl != (Text *)0x0) {
    std::default_delete<Text>::operator()((default_delete<Text> *)&local_58,local_58._M_head_impl);
  }
  return local_48;
}

Assistant:

Patch::Node *Patch::build_node(Node *left, Node *right,
                       Point old_distance_from_left_ancestor,
                       Point new_distance_from_left_ancestor,
                       Point old_extent, Point new_extent,
                       optional<Text> &&old_text, optional<Text> &&new_text,
                       uint32_t old_text_size) {
  change_count++;
  return new Node{
    left,
    right,
    old_extent,
    new_extent,
    old_distance_from_left_ancestor,
    new_distance_from_left_ancestor,
    old_text ? unique_ptr<Text>{new Text(*old_text)} : nullptr,
    new_text ? unique_ptr<Text>{new Text(*new_text)} : nullptr,
    old_text_size
  };
}